

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall testing::TestCase::successful_test_count(TestCase *this)

{
  pointer ppTVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer ppTVar5;
  
  ppTVar1 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (ppTVar5 = (this->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar5 != ppTVar1; ppTVar5 = ppTVar5 + 1
      ) {
    uVar3 = 0;
    if ((*ppTVar5)->should_run_ == true) {
      bVar2 = TestResult::Failed(&(*ppTVar5)->result_);
      uVar3 = (uint)!bVar2;
    }
    iVar4 = iVar4 + uVar3;
  }
  return iVar4;
}

Assistant:

int TestCase::successful_test_count() const {
  return CountIf(test_info_list_, TestPassed);
}